

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::Rollup::Add(Rollup *this,Rollup *other)

{
  long lVar1;
  __uniq_ptr_impl<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *this_00;
  pointer __p;
  __node_base *p_Var2;
  Rollup *this_01;
  
  lVar1 = other->file_total_;
  this->vm_total_ = this->vm_total_ + other->vm_total_;
  this->file_total_ = this->file_total_ + lVar1;
  p_Var2 = &(other->children_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    this_00 = (__uniq_ptr_impl<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)
              std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->children_,(key_type *)(p_Var2 + 1));
    this_01 = (this_00->_M_t).
              super__Tuple_impl<0UL,_bloaty::Rollup_*,_std::default_delete<bloaty::Rollup>_>.
              super__Head_base<0UL,_bloaty::Rollup_*,_false>._M_head_impl;
    if (this_01 == (Rollup *)0x0) {
      __p = (pointer)operator_new(0x60);
      __p->vm_total_ = 0;
      __p->file_total_ = 0;
      __p->filtered_vm_total_ = 0;
      __p->filtered_file_total_ = 0;
      __p->filter_regex_ = (ReImpl *)0x0;
      (__p->children_)._M_h._M_buckets = &(__p->children_)._M_h._M_single_bucket;
      (__p->children_)._M_h._M_bucket_count = 1;
      (__p->children_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
      (__p->children_)._M_h._M_element_count = 0;
      (__p->children_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      *(undefined1 (*) [16])&(__p->children_)._M_h._M_rehash_policy._M_next_resize =
           (undefined1  [16])0x0;
      std::__uniq_ptr_impl<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::reset(this_00,__p)
      ;
      this_01 = (this_00->_M_t).
                super__Tuple_impl<0UL,_bloaty::Rollup_*,_std::default_delete<bloaty::Rollup>_>.
                super__Head_base<0UL,_bloaty::Rollup_*,_false>._M_head_impl;
    }
    Add(this_01,(Rollup *)p_Var2[5]._M_nxt);
  }
  return;
}

Assistant:

void Add(const Rollup& other) {
    vm_total_ += other.vm_total_;
    file_total_ += other.file_total_;

    for (const auto& other_child : other.children_) {
      auto& child = children_[other_child.first];
      if (child.get() == NULL) {
        child.reset(new Rollup());
      }
      child->Add(*other_child.second);
    }
  }